

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecUnary(Parser *this,string *msg,bool emptyAllowed)

{
  bool bVar1;
  byte in_CL;
  allocator<char> local_111;
  string local_110 [32];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  string local_d0 [32];
  undefined1 local_b0 [8];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> referringTypename;
  optional<enact::Token> region;
  undefined1 local_60 [8];
  optional<enact::Token> permission;
  bool emptyAllowed_local;
  string *msg_local;
  Parser *this_local;
  
  permission.super__Optional_base<enact::Token,_false,_false>._M_payload.
  super__Optional_payload<enact::Token,_true,_false,_false>.
  super__Optional_payload_base<enact::Token>._55_1_ = in_CL & 1;
  bVar1 = consume((Parser *)msg,AMPERSAND);
  if (bVar1) {
    std::optional<enact::Token>::optional((optional<enact::Token> *)local_60);
    bVar1 = consume((Parser *)msg,MUT);
    if ((bVar1) || (bVar1 = consume((Parser *)msg,IMM), bVar1)) {
      std::optional<enact::Token>::operator=
                ((optional<enact::Token> *)local_60,(Token *)&msg[5].field_2);
    }
    std::optional<enact::Token>::optional((optional<enact::Token> *)&referringTypename);
    bVar1 = consume((Parser *)msg,SO);
    if (((bVar1) || (bVar1 = consume((Parser *)msg,RC), bVar1)) ||
       (bVar1 = consume((Parser *)msg,GC), bVar1)) {
      std::optional<enact::Token>::operator=
                ((optional<enact::Token> *)&referringTypename,(Token *)&msg[5].field_2);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_d0,"Expected typename after \'&\'.",(allocator<char> *)(local_e0 + 0xf));
    expectTypenamePrecUnary((Parser *)local_b0,msg,SUB81(local_d0,0));
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(local_e0 + 0xf));
    std::
    make_unique<enact::ReferenceTypename,std::optional<enact::Token>,std::optional<enact::Token>,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
              ((optional<enact::Token> *)local_e0,(optional<enact::Token> *)local_60,
               &referringTypename);
    std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
    unique_ptr<enact::ReferenceTypename,std::default_delete<enact::ReferenceTypename>,void>
              ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)this,
               (unique_ptr<enact::ReferenceTypename,_std::default_delete<enact::ReferenceTypename>_>
                *)local_e0);
    std::unique_ptr<enact::ReferenceTypename,_std::default_delete<enact::ReferenceTypename>_>::
    ~unique_ptr((unique_ptr<enact::ReferenceTypename,_std::default_delete<enact::ReferenceTypename>_>
                 *)local_e0);
    std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
              ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_b0);
    std::optional<enact::Token>::~optional((optional<enact::Token> *)&referringTypename);
    std::optional<enact::Token>::~optional((optional<enact::Token> *)local_60);
  }
  else {
    bVar1 = consume((Parser *)msg,QUESTION);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_110,"Expected typename after \'?\'.",&local_111);
      expectTypenamePrecUnary((Parser *)local_f0,msg,SUB81(local_110,0));
      std::
      make_unique<enact::OptionalTypename,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                 (local_f0 + 8));
      std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
      unique_ptr<enact::OptionalTypename,std::default_delete<enact::OptionalTypename>,void>
                ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)
                 this,(unique_ptr<enact::OptionalTypename,_std::default_delete<enact::OptionalTypename>_>
                       *)(local_f0 + 8));
      std::unique_ptr<enact::OptionalTypename,_std::default_delete<enact::OptionalTypename>_>::
      ~unique_ptr((unique_ptr<enact::OptionalTypename,_std::default_delete<enact::OptionalTypename>_>
                   *)(local_f0 + 8));
      std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
      ~unique_ptr((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                  local_f0);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator(&local_111);
    }
    else {
      expectTypenamePrecParametric(this,msg,emptyAllowed);
    }
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecUnary(const std::string &msg, bool emptyAllowed) {
        if (consume(TokenType::AMPERSAND)) {
            std::optional<Token> permission;
            if (consume(TokenType::MUT) || consume(TokenType::IMM)) {
                permission = m_previous;
            }

            std::optional<Token> region;
            if (consume(TokenType::SO) || consume(TokenType::RC) || consume(TokenType::GC)) {
                region = m_previous;
            }

            std::unique_ptr<const Typename> referringTypename = expectTypenamePrecUnary("Expected typename after '&'.");

            return std::make_unique<ReferenceTypename>(
                    std::move(permission),
                    std::move(region),
                    std::move(referringTypename));
        }
        if (consume(TokenType::QUESTION)) {
            return std::make_unique<OptionalTypename>(expectTypenamePrecUnary("Expected typename after '?'."));
        }

        return expectTypenamePrecParametric(msg, emptyAllowed);
    }